

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O1

void __thiscall ki::protocol::net::ServerSession::on_keep_alive(ServerSession *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  ClientKeepAlive data;
  ClientKeepAlive keep_alive;
  ClientKeepAlive local_30;
  ClientKeepAlive local_20;
  
  control::ClientKeepAlive::ClientKeepAlive(&local_20,0,0,0);
  p_Var1 = this->_vptr_ServerSession[-3];
  control::ClientKeepAlive::ClientKeepAlive(&local_30,0,0,0);
  control::ClientKeepAlive::read_from(&local_30,(istream *)(&this->field_0x40 + (long)p_Var1));
  local_20.m_minutes = local_30.m_minutes;
  local_20.m_session_id = local_30.m_session_id;
  local_20.m_milliseconds = local_30.m_milliseconds;
  uVar3 = std::chrono::_V2::steady_clock::now();
  pp_Var2 = this->_vptr_ServerSession;
  *(undefined8 *)(&this->field_0x28 + (long)pp_Var2[-3]) = uVar3;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ServerSession + (long)pp_Var2[-3]),true,'\x04',
             &local_20.super_Serializable);
  return;
}

Assistant:

void ServerSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ClientKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ClientKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}